

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5ExprNearset *
sqlite3Fts5ParseNearset(Fts5Parse *pParse,Fts5ExprNearset *pNear,Fts5ExprPhrase *pPhrase)

{
  Fts5ExprPhrase *pPhrase_00;
  int iVar1;
  Fts5ExprNearset *pFVar2;
  
  if (pParse->rc == 0) {
    if (pPhrase == (Fts5ExprPhrase *)0x0) {
      return pNear;
    }
    if (pNear == (Fts5ExprNearset *)0x0) {
      pFVar2 = (Fts5ExprNearset *)sqlite3_malloc64(0x60);
      if (pFVar2 == (Fts5ExprNearset *)0x0) goto LAB_001bad07;
      *(undefined8 *)&pFVar2[2].nPhrase = 0;
      pFVar2[2].apPhrase[0] = (Fts5ExprPhrase *)0x0;
      *(undefined8 *)(pFVar2 + 2) = 0;
      pFVar2[2].pColset = (Fts5Colset *)0x0;
      *(undefined8 *)&pFVar2[1].nPhrase = 0;
      pFVar2[1].apPhrase[0] = (Fts5ExprPhrase *)0x0;
      *(undefined8 *)(pFVar2 + 1) = 0;
      pFVar2[1].pColset = (Fts5Colset *)0x0;
      *(undefined8 *)&pFVar2->nPhrase = 0;
      pFVar2->apPhrase[0] = (Fts5ExprPhrase *)0x0;
      *(undefined8 *)pFVar2 = 0;
      pFVar2->pColset = (Fts5Colset *)0x0;
    }
    else {
      pFVar2 = pNear;
      if ((((long)pNear->nPhrase & 7U) == 0) &&
         (pFVar2 = (Fts5ExprNearset *)sqlite3_realloc64(pNear,(long)pNear->nPhrase * 8 + 0x60),
         pFVar2 == (Fts5ExprNearset *)0x0)) {
LAB_001bad07:
        pParse->rc = 7;
        goto LAB_001bac43;
      }
    }
    iVar1 = pFVar2->nPhrase;
    if (0 < iVar1) {
      pPhrase_00 = pFVar2->apPhrase[iVar1 - 1];
      if (pPhrase->nTerm == 0) {
        fts5ExprPhraseFree(pPhrase);
        iVar1 = pFVar2->nPhrase + -1;
        pParse->nPhrase = pParse->nPhrase + -1;
        pPhrase = pPhrase_00;
      }
      else if (pPhrase_00->nTerm == 0) {
        fts5ExprPhraseFree(pPhrase_00);
        iVar1 = pParse->nPhrase;
        pParse->apPhrase[(long)iVar1 + -2] = pPhrase;
        pParse->nPhrase = iVar1 + -1;
        iVar1 = pFVar2->nPhrase + -1;
      }
    }
    pFVar2->nPhrase = iVar1 + 1;
    pFVar2->apPhrase[iVar1] = pPhrase;
  }
  else {
LAB_001bac43:
    sqlite3Fts5ParseNearsetFree(pNear);
    fts5ExprPhraseFree(pPhrase);
    pFVar2 = (Fts5ExprNearset *)0x0;
  }
  return pFVar2;
}

Assistant:

static Fts5ExprNearset *sqlite3Fts5ParseNearset(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprNearset *pNear,         /* Existing nearset, or NULL */
  Fts5ExprPhrase *pPhrase         /* Recently parsed phrase */
){
  const int SZALLOC = 8;
  Fts5ExprNearset *pRet = 0;

  if( pParse->rc==SQLITE_OK ){
    if( pPhrase==0 ){
      return pNear;
    }
    if( pNear==0 ){
      sqlite3_int64 nByte;
      nByte = sizeof(Fts5ExprNearset) + SZALLOC * sizeof(Fts5ExprPhrase*);
      pRet = sqlite3_malloc64(nByte);
      if( pRet==0 ){
        pParse->rc = SQLITE_NOMEM;
      }else{
        memset(pRet, 0, (size_t)nByte);
      }
    }else if( (pNear->nPhrase % SZALLOC)==0 ){
      int nNew = pNear->nPhrase + SZALLOC;
      sqlite3_int64 nByte;

      nByte = sizeof(Fts5ExprNearset) + nNew * sizeof(Fts5ExprPhrase*);
      pRet = (Fts5ExprNearset*)sqlite3_realloc64(pNear, nByte);
      if( pRet==0 ){
        pParse->rc = SQLITE_NOMEM;
      }
    }else{
      pRet = pNear;
    }
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3Fts5ParseNearsetFree(pNear);
    sqlite3Fts5ParsePhraseFree(pPhrase);
  }else{
    if( pRet->nPhrase>0 ){
      Fts5ExprPhrase *pLast = pRet->apPhrase[pRet->nPhrase-1];
      assert( pLast==pParse->apPhrase[pParse->nPhrase-2] );
      if( pPhrase->nTerm==0 ){
        fts5ExprPhraseFree(pPhrase);
        pRet->nPhrase--;
        pParse->nPhrase--;
        pPhrase = pLast;
      }else if( pLast->nTerm==0 ){
        fts5ExprPhraseFree(pLast);
        pParse->apPhrase[pParse->nPhrase-2] = pPhrase;
        pParse->nPhrase--;
        pRet->nPhrase--;
      }
    }
    pRet->apPhrase[pRet->nPhrase++] = pPhrase;
  }
  return pRet;
}